

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float32 float128_to_float32_aarch64(float128 a,float_status *status)

{
  commonNaNT a_00;
  float128 a_01;
  float128 a_02;
  float128 a_03;
  float128 a_04;
  commonNaNT local_60;
  uint32_t local_44;
  uint64_t uStack_40;
  uint32_t zSig;
  uint64_t aSig1;
  uint64_t aSig0;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  float128 a_local;
  
  a_local.low = a.high;
  status_local = (float_status *)a.low;
  _aExp = status;
  uStack_40 = extractFloat128Frac1(a);
  a_01.high = a_local.low;
  a_01.low = (uint64_t)status_local;
  aSig1 = extractFloat128Frac0(a_01);
  a_02.high = a_local.low;
  a_02.low = (uint64_t)status_local;
  aSig0._0_4_ = extractFloat128Exp(a_02);
  a_03.high = a_local.low;
  a_03.low = (uint64_t)status_local;
  aSig0._7_1_ = extractFloat128Sign(a_03);
  if ((int32_t)aSig0 == 0x7fff) {
    if (aSig1 == 0 && uStack_40 == 0) {
      a_local.high._4_4_ = packFloat32(aSig0._7_1_,0xff,0);
    }
    else {
      a_04.high = a_local.low;
      a_04.low = (uint64_t)status_local;
      float128ToCommonNaN(&local_60,a_04,_aExp);
      a_00.high = local_60.high;
      a_00.sign = local_60.sign;
      a_00._1_7_ = local_60._1_7_;
      a_00.low = local_60.low;
      a_local.high._4_4_ = commonNaNToFloat32(a_00,_aExp);
    }
  }
  else {
    aSig1 = (long)(int)(uint)(uStack_40 != 0) | aSig1;
    shift64RightJamming(aSig1,0x12,&aSig1);
    local_44 = (uint32_t)aSig1;
    if (((int32_t)aSig0 != 0) || (local_44 != 0)) {
      local_44 = local_44 | 0x40000000;
      aSig0._0_4_ = (int32_t)aSig0 + -0x3f81;
    }
    a_local.high._4_4_ = roundAndPackFloat32(aSig0._7_1_,(int32_t)aSig0,local_44,_aExp);
  }
  return a_local.high._4_4_;
}

Assistant:

float32 float128_to_float32(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig0, aSig1;
    uint32_t zSig;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( aSig0 | aSig1 ) {
            return commonNaNToFloat32(float128ToCommonNaN(a, status), status);
        }
        return packFloat32( aSign, 0xFF, 0 );
    }
    aSig0 |= ( aSig1 != 0 );
    shift64RightJamming( aSig0, 18, &aSig0 );
    zSig = aSig0;
    if ( aExp || zSig ) {
        zSig |= 0x40000000;
        aExp -= 0x3F81;
    }
    return roundAndPackFloat32(aSign, aExp, zSig, status);

}